

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReaderManager.cpp
# Opt level: O0

AbstractReader * __thiscall
BufferedReaderManager::getReader(BufferedReaderManager *this,char *streamName)

{
  uint32_t uVar1;
  const_reference ppBVar2;
  uint local_24;
  uint local_20;
  uint32_t i;
  uint32_t minReaderIndex;
  uint32_t minReaderCnt;
  char *streamName_local;
  BufferedReaderManager *this_local;
  
  i = 0xffffffff;
  local_20 = 0;
  for (local_24 = 0; local_24 < this->m_readersCnt; local_24 = local_24 + 1) {
    ppBVar2 = std::vector<BufferedReader_*,_std::allocator<BufferedReader_*>_>::operator[]
                        (&this->m_fileReaders,(ulong)local_24);
    uVar1 = BufferedReader::getReaderCount(*ppBVar2);
    if (uVar1 < i) {
      ppBVar2 = std::vector<BufferedReader_*,_std::allocator<BufferedReader_*>_>::operator[]
                          (&this->m_fileReaders,(ulong)local_24);
      i = BufferedReader::getReaderCount(*ppBVar2);
      local_20 = local_24;
    }
  }
  ppBVar2 = std::vector<BufferedReader_*,_std::allocator<BufferedReader_*>_>::operator[]
                      (&this->m_fileReaders,(ulong)local_20);
  return &(*ppBVar2)->super_AbstractReader;
}

Assistant:

AbstractReader* BufferedReaderManager::getReader(const char* streamName) const
{
    uint32_t minReaderCnt = UINT_MAX;
    uint32_t minReaderIndex = 0;

    for (uint32_t i = 0; i < m_readersCnt; i++)
    {
        if (m_fileReaders[i]->getReaderCount() < minReaderCnt)
        {
            minReaderCnt = m_fileReaders[i]->getReaderCount();
            minReaderIndex = i;
        }
    }
    return m_fileReaders[minReaderIndex];
}